

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<StatementNode,_std::default_delete<StatementNode>_> __thiscall
Parser::parseReturnStatement(Parser *this)

{
  Mark MVar1;
  Mark *pMVar2;
  Token *pTVar3;
  Tokenizer *in_RSI;
  allocator<char> local_49;
  istream *local_48;
  _Alloc_hider local_40;
  
  pMVar2 = Stream::getMark(&in_RSI->stream_);
  MVar1 = *pMVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffc0,"Expected return statement!",
             (allocator<char> *)&local_48);
  expectToken((Parser *)in_RSI,KeywordRet,(string *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  pTVar3 = Tokenizer::peek(in_RSI);
  if (pTVar3->type == Backslash) {
    parseLambda((Parser *)&stack0xffffffffffffffc0);
  }
  else {
    parseArithmeticExpression((Parser *)&stack0xffffffffffffffc0);
  }
  local_48 = (istream *)local_40._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffc0,"Expected semicolon!",&local_49);
  expectToken((Parser *)in_RSI,Semicolon,(string *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::make_unique<ReturnNode,std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>>
            ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
             &stack0xffffffffffffffc0);
  *(Mark *)(local_40._M_p + 8) = MVar1;
  (this->tokenizer_).stream_.is_ = (istream *)local_40._M_p;
  if (local_48 != (istream *)0x0) {
    (**(code **)(*(long *)local_48 + 8))();
  }
  return (__uniq_ptr_data<StatementNode,_std::default_delete<StatementNode>,_true,_true>)
         (__uniq_ptr_data<StatementNode,_std::default_delete<StatementNode>,_true,_true>)this;
}

Assistant:

std::unique_ptr<StatementNode> Parser::parseReturnStatement()
{
  const auto mark = tokenizer_.getMark();
  expectToken(TokenType::KeywordRet, "Expected return statement!");
  std::unique_ptr<ExpressionNode> value = nullptr;

  if(tokenizer_.peek().type == TokenType::Backslash)
    value = parseLambda();
  else
    value = parseArithmeticExpression();

  expectToken(TokenType::Semicolon, "Expected semicolon!");
  auto node = std::make_unique<ReturnNode>(std::move(value));
  node->setMark(mark);
  return node;
}